

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O3

Token * __thiscall
wabt::WastLexer::LiteralToken
          (Token *__return_storage_ptr__,WastLexer *this,TokenType token_type,
          LiteralType literal_type)

{
  char *pcVar1;
  char *pcVar2;
  Location loc;
  int iVar3;
  char *pcVar4;
  int iVar5;
  bool bVar6;
  undefined4 uStack_3c;
  Literal local_38;
  
  pcVar1 = this->token_start_;
  iVar3 = ((int)pcVar1 - *(int *)&this->line_start_) + 1;
  if (iVar3 < 2) {
    iVar3 = 1;
  }
  pcVar2 = this->cursor_;
  iVar5 = ((int)pcVar2 - *(int *)&this->line_start_) + 1;
  if (iVar5 < 2) {
    iVar5 = 1;
  }
  bVar6 = this->buffer_end_ <= pcVar1;
  pcVar4 = pcVar2 + -(long)pcVar1;
  local_38.text._M_len = (size_t)pcVar4;
  if (bVar6 || (pcVar1 > pcVar2 || pcVar4 == (char *)0x0)) {
    local_38.text._M_len = (size_t)(char *)0x0;
  }
  local_38.text._M_str = (char *)0x0;
  if (!bVar6 && (pcVar1 <= pcVar2 && pcVar4 != (char *)0x0)) {
    local_38.text._M_str = pcVar1;
  }
  loc.field_1.field_0.first_column = iVar3;
  loc.field_1.field_0.line = this->line_;
  loc.field_1._12_4_ = uStack_3c;
  loc.field_1.field_0.last_column = iVar5;
  loc.filename._M_str = (this->filename_)._M_dataplus._M_p;
  loc.filename._M_len = (this->filename_)._M_string_length;
  local_38.type = literal_type;
  Token::Token(__return_storage_ptr__,loc,token_type,&local_38);
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::LiteralToken(TokenType token_type, LiteralType literal_type) {
  return Token(GetLocation(), token_type, Literal(literal_type, GetText()));
}